

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_socket(connectdata *conn,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,
                    curl_socket_t *sockfd)

{
  anon_enum_32 aVar1;
  Curl_easy *data;
  uint uVar2;
  curl_socket_t cVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_sockaddr_ex *pCVar6;
  int __protocol;
  Curl_sockaddr_ex *pCVar7;
  int __type;
  Curl_sockaddr_ex dummy;
  
  data = conn->data;
  pCVar6 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar6 = &dummy;
  }
  iVar4 = ai->ai_family;
  pCVar6->family = iVar4;
  aVar1 = conn->transport;
  __type = (aVar1 != TRNSPRT_TCP) + 1;
  pCVar6->socktype = __type;
  if (aVar1 == TRNSPRT_TCP) {
    __protocol = ai->ai_protocol;
  }
  else {
    __protocol = 0x11;
  }
  pCVar7 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar7 = &dummy;
  }
  pCVar7->protocol = __protocol;
  uVar2 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar2 = ai->ai_addrlen;
  }
  pCVar7->addrlen = uVar2;
  memcpy(&pCVar7->_sa_ex_u,ai->ai_addr,(ulong)uVar2);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    iVar4 = socket(iVar4,__type,__protocol);
    *sockfd = iVar4;
  }
  else {
    Curl_set_in_callback(data,true);
    cVar3 = (*(data->set).fopensocket)
                      ((data->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)pCVar6);
    *sockfd = cVar3;
    Curl_set_in_callback(data,false);
    iVar4 = *sockfd;
  }
  if (iVar4 == -1) {
    CVar5 = CURLE_COULDNT_CONNECT;
  }
  else {
    if (conn->transport == TRNSPRT_QUIC) {
      curlx_nonblock(iVar4,1);
    }
    CVar5 = CURLE_OK;
    if ((conn->scope_id != 0) && (CVar5 = CURLE_OK, pCVar6->family == 10)) {
      pCVar6 = &dummy;
      if (addr != (Curl_sockaddr_ex *)0x0) {
        pCVar6 = addr;
      }
      *(uint *)((long)&pCVar6->_sa_ex_u + 0x18) = conn->scope_id;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_socket(struct connectdata *conn,
                     const Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct Curl_easy *data = conn->data;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  addr->socktype = (conn->transport == TRNSPRT_TCP) ? SOCK_STREAM : SOCK_DGRAM;
  addr->protocol = conn->transport != TRNSPRT_TCP ? IPPROTO_UDP :
    ai->ai_protocol;
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, true);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, false);
  }
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

  if(conn->transport == TRNSPRT_QUIC) {
    /* QUIC sockets need to be nonblocking */
    (void)curlx_nonblock(*sockfd, TRUE);
  }

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope_id;
  }
#endif

  return CURLE_OK;

}